

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.h
# Opt level: O0

__pid_t __thiscall MppThread::wait(MppThread *this,void *__stat_loc)

{
  MppThreadStatus MVar1;
  char *__stat_loc_00;
  MppThreadStatus status;
  MppThreadSignal id_local;
  MppThread *this_local;
  
  __stat_loc_00 = (char *)__stat_loc;
  if (3 < (int)__stat_loc) {
    __stat_loc_00 = "mpp_enc";
    _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"id < THREAD_SIGNAL_BUTT",
               "wait",0x105);
    if ((mpp_debug & 0x10000000) != 0) {
      abort();
    }
  }
  MVar1 = this->mStatus[(ulong)__stat_loc & 0xffffffff];
  this->mStatus[(ulong)__stat_loc & 0xffffffff] = MPP_THREAD_WAITING;
  MppMutexCond::wait(this->mMutexCond + ((ulong)__stat_loc & 0xffffffff),__stat_loc_00);
  if (this->mStatus[(ulong)__stat_loc & 0xffffffff] == MPP_THREAD_WAITING) {
    this->mStatus[(ulong)__stat_loc & 0xffffffff] = MVar1;
  }
  return (__pid_t)this;
}

Assistant:

void wait(MppThreadSignal id = THREAD_WORK) {
        mpp_assert(id < THREAD_SIGNAL_BUTT);
        MppThreadStatus status = mStatus[id];

        mStatus[id] = MPP_THREAD_WAITING;
        mMutexCond[id].wait();

        // check the status is not changed then restore status
        if (mStatus[id] == MPP_THREAD_WAITING)
            mStatus[id] = status;
    }